

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAuto.c
# Opt level: O0

void Abc_NtkAutoPrint(Abc_Ntk_t *pNtk,int Output,int fNaive,int fVerbose)

{
  int nInputs_00;
  int nOutputs_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  DdManager *dd_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  DdNode **pbOutputs;
  char **pInputNames_00;
  char **pOutputNames_00;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFuncsGlob;
  int i;
  int nInputs;
  int nOutputs;
  char **pOutputNames;
  char **pInputNames;
  DdNode **pbGlobal;
  DdManager *dd;
  int fVerbose_local;
  int fNaive_local;
  int Output_local;
  Abc_Ntk_t *pNtk_local;
  
  pvVar4 = Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
  if (pvVar4 != (void *)0x0) {
    nInputs_00 = Abc_NtkCiNum(pNtk);
    nOutputs_00 = Abc_NtkCoNum(pNtk);
    dd_00 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
    iVar1 = Abc_NtkCoNum(pNtk);
    p = Vec_PtrAlloc(iVar1);
    for (vFuncsGlob._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk), vFuncsGlob._4_4_ < iVar1;
        vFuncsGlob._4_4_ = vFuncsGlob._4_4_ + 1) {
      pObj_00 = Abc_NtkCo(pNtk,vFuncsGlob._4_4_);
      pvVar4 = Abc_ObjGlobalBdd(pObj_00);
      Vec_PtrPush(p,pvVar4);
    }
    pbOutputs = (DdNode **)Vec_PtrArray(p);
    pInputNames_00 = Abc_NtkCollectCioNames(pNtk,0);
    pOutputNames_00 = Abc_NtkCollectCioNames(pNtk,1);
    if (fVerbose != 0) {
      uVar2 = Cudd_ReadKeys(dd_00);
      uVar3 = Cudd_ReadDead(dd_00);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar2 - uVar3));
    }
    for (vFuncsGlob._4_4_ = 0; vFuncsGlob._4_4_ < nInputs_00;
        vFuncsGlob._4_4_ = vFuncsGlob._4_4_ + 1) {
      Cudd_bddNewVar(dd_00);
    }
    iVar1 = Cudd_ReadSize(dd_00);
    if (iVar1 != nInputs_00 * 2) {
      __assert_fail("Cudd_ReadSize(dd) == 2 * nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcAuto.c"
                    ,0x5b,"void Abc_NtkAutoPrint(Abc_Ntk_t *, int, int, int)");
    }
    Cudd_zddVarsFromBddVars(dd_00,2);
    if (Output == -1) {
      Abc_NtkAutoPrintAll(dd_00,nInputs_00,pbOutputs,nOutputs_00,pInputNames_00,pOutputNames_00,
                          fNaive);
    }
    else {
      Abc_NtkAutoPrintOne(dd_00,nInputs_00,pbOutputs,Output,pInputNames_00,pOutputNames_00,fNaive);
    }
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (pInputNames_00 != (char **)0x0) {
      free(pInputNames_00);
    }
    if (pOutputNames_00 != (char **)0x0) {
      free(pOutputNames_00);
    }
    Vec_PtrFree(p);
  }
  return;
}

Assistant:

void Abc_NtkAutoPrint( Abc_Ntk_t * pNtk, int Output, int fNaive, int fVerbose )
{
    DdManager * dd;         // the BDD manager used to hold shared BDDs
    DdNode ** pbGlobal;     // temporary storage for global BDDs
    char ** pInputNames;    // pointers to the CI names
    char ** pOutputNames;   // pointers to the CO names
    int nOutputs, nInputs, i;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;

    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, 10000000, 1, 1, 0, fVerbose) == NULL )
        return;

    // get information about the network
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
//    dd       = pNtk->pManGlob;
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    pbGlobal = (DdNode **)Vec_PtrArray( vFuncsGlob );

    // get the network names
    pInputNames = Abc_NtkCollectCioNames( pNtk, 0 );
    pOutputNames = Abc_NtkCollectCioNames( pNtk, 1 );

    // print the size of the BDDs
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // allocate additional variables
    for ( i = 0; i < nInputs; i++ )
        Cudd_bddNewVar( dd );
    assert( Cudd_ReadSize(dd) == 2 * nInputs );

    // create ZDD variables in the manager
    Cudd_zddVarsFromBddVars( dd, 2 );

    // perform the analysis of the primary output functions for auto-symmetry
    if ( Output == -1 )
        Abc_NtkAutoPrintAll( dd, nInputs, pbGlobal, nOutputs, pInputNames, pOutputNames, fNaive );
    else
        Abc_NtkAutoPrintOne( dd, nInputs, pbGlobal, Output, pInputNames, pOutputNames, fNaive );

    // deref the PO functions
//    Abc_NtkFreeGlobalBdds( pNtk );
    // stop the global BDD manager
//    Extra_StopManager( pNtk->pManGlob );
//    pNtk->pManGlob = NULL;
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( pInputNames );
    ABC_FREE( pOutputNames );
    Vec_PtrFree( vFuncsGlob );
}